

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLogic.cpp
# Opt level: O1

Object * __thiscall CmdLogic::execute(CmdLogic *this,Engine *engine)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  Object *object;
  undefined4 extraout_var_00;
  Object *object_00;
  ObjectBool *pOVar7;
  runtime_error *this_00;
  char cVar8;
  
  iVar4 = (**this->left->_vptr_ICommand)();
  object = getPureObject((Object *)CONCAT44(extraout_var,iVar4));
  iVar4 = (**this->right->_vptr_ICommand)();
  object_00 = getPureObject((Object *)CONCAT44(extraout_var_00,iVar4));
  uVar5 = (**object->_vptr_Object)(object);
  iVar4 = (**object_00->_vptr_Object)(object_00);
  cVar1 = (char)iVar4;
  cVar8 = (char)uVar5;
  if (this->operation == NOTEQUALS) {
    if (cVar8 != cVar1) {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      ObjectBool::ObjectBool(pOVar7,true);
      return &pOVar7->super_Object;
    }
    if (cVar8 == '\0') {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      iVar4 = getIntOrCrash(object);
      iVar6 = getIntOrCrash(object_00);
      ObjectBool::ObjectBool(pOVar7,iVar4 != iVar6);
      return &pOVar7->super_Object;
    }
    if ((uVar5 & 0xff) == 1) {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      bVar2 = getBoolOrCrash(object);
      bVar3 = getBoolOrCrash(object_00);
      ObjectBool::ObjectBool(pOVar7,bVar2 != bVar3);
      return &pOVar7->super_Object;
    }
  }
  else if (this->operation == EQUALS) {
    if (cVar8 != cVar1) {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      ObjectBool::ObjectBool(pOVar7,false);
      return &pOVar7->super_Object;
    }
    if (cVar8 == '\0') {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      iVar4 = getIntOrCrash(object);
      iVar6 = getIntOrCrash(object_00);
      ObjectBool::ObjectBool(pOVar7,iVar4 == iVar6);
      return &pOVar7->super_Object;
    }
    if ((uVar5 & 0xff) == 1) {
      pOVar7 = (ObjectBool *)operator_new(0x10);
      bVar2 = getBoolOrCrash(object);
      bVar3 = getBoolOrCrash(object_00);
      ObjectBool::ObjectBool(pOVar7,bVar2 == bVar3);
      return &pOVar7->super_Object;
    }
  }
  if (cVar1 != '\0' || cVar8 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"CmdLogic::execute => can\'t compare different types!");
LAB_0010534c:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = getIntOrCrash(object);
  iVar6 = getIntOrCrash(object_00);
  switch(this->operation) {
  case LESSER:
    pOVar7 = (ObjectBool *)operator_new(0x10);
    ObjectBool::ObjectBool(pOVar7,iVar4 < iVar6);
    break;
  case GREATER:
    pOVar7 = (ObjectBool *)operator_new(0x10);
    ObjectBool::ObjectBool(pOVar7,iVar6 < iVar4);
    break;
  case LESSER_EQUALS:
    pOVar7 = (ObjectBool *)operator_new(0x10);
    ObjectBool::ObjectBool(pOVar7,iVar4 <= iVar6);
    break;
  case GREATER_EQUALS:
    pOVar7 = (ObjectBool *)operator_new(0x10);
    ObjectBool::ObjectBool(pOVar7,iVar6 <= iVar4);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"CmdLogic::execute => unknown operation!");
    goto LAB_0010534c;
  }
  return &pOVar7->super_Object;
}

Assistant:

Object *CmdLogic::execute(Engine *engine) {
	Object* object1 = getPureObject(left->execute(engine));
	Object* object2 = getPureObject(right->execute(engine));
	ObjectType type1 = object1->getType();
	ObjectType type2 = object2->getType();
	
	switch (this->operation) {
		case EQUALS:
			if (type1 == type2) {
				switch (type1) {
					case OT_BOOL:
						return new ObjectBool(getBoolOrCrash(object1) == getBoolOrCrash(object2));
					case OT_INT:
						return new ObjectBool(getIntOrCrash(object1) == getIntOrCrash(object2));
				}
			} else {
				return new ObjectBool(false);
			}
			break;
		case NOTEQUALS:
			if (type1 == type2) {
				switch (type1) {
					case OT_BOOL:
						return new ObjectBool(getBoolOrCrash(object1) != getBoolOrCrash(object2));
					case OT_INT:
						return new ObjectBool(getIntOrCrash(object1) != getIntOrCrash(object2));
				}
			} else {
				return new ObjectBool(true);
			}
			break;
		default:
			break;
	}
	if (type1 == OT_INT && type2 == OT_INT) {
		int x1 = getIntOrCrash(object1);
		int x2 = getIntOrCrash(object2);
		switch (this->operation) {
			case LESSER:
				return new ObjectBool(x1 < x2);
			case GREATER:
				return new ObjectBool(x1 > x2);
			case LESSER_EQUALS:
				return new ObjectBool(x1 <= x2);
			case GREATER_EQUALS:
				return new ObjectBool(x1 >= x2);
			default:
				throw std::runtime_error("CmdLogic::execute => unknown operation!");
		}
	} else {
		throw std::runtime_error("CmdLogic::execute => can't compare different types!");
	}
}